

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefTask>::
expand(Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefTask>
       *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DerefTask *pDVar3;
  undefined8 uVar4;
  DerefTask *pDVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  
  sVar9 = 8;
  if (this->_capacity != 0) {
    sVar9 = this->_capacity * 2;
  }
  uVar7 = sVar9 * 0x18;
  if (uVar7 == 0) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar7 < 0x11) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar7 < 0x19) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar7 < 0x21) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar7 < 0x31) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar7 < 0x41) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pDVar5 = (DerefTask *)::operator_new(uVar7,0x10);
  }
  if (this->_capacity != 0) {
    uVar7 = this->_capacity;
    if (uVar7 != 0) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        pDVar3 = this->_stack;
        *(undefined8 *)((long)&(pDVar5->trm).t._content + lVar6) =
             *(undefined8 *)((long)&(pDVar3->trm).t._content + lVar6);
        puVar1 = (undefined8 *)((long)&(pDVar3->var)._content + lVar6);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pDVar5->var)._content + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar8 = uVar8 + 1;
        uVar7 = this->_capacity;
        lVar6 = lVar6 + 0x18;
      } while (uVar8 < uVar7);
    }
    pDVar3 = this->_stack;
    if (pDVar3 != (DerefTask *)0x0) {
      uVar7 = uVar7 * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar7 == 0) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pDVar3;
      }
      else if (uVar7 < 0x11) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pDVar3;
      }
      else if (uVar7 < 0x19) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pDVar3;
      }
      else if (uVar7 < 0x21) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pDVar3;
      }
      else if (uVar7 < 0x31) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar3;
      }
      else if (uVar7 < 0x41) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pDVar3;
      }
      else {
        operator_delete(pDVar3,0x10);
      }
    }
  }
  this->_stack = pDVar5;
  this->_cursor = pDVar5 + this->_capacity;
  this->_end = pDVar5 + sVar9;
  this->_capacity = sVar9;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }